

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory_mapper.cpp
# Opt level: O1

void __thiscall
pstore::system_page_size_interface::~system_page_size_interface(system_page_size_interface *this)

{
  code *pcVar1;
  
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

void memory_mapper_base::read_only (void * const addr, std::size_t const len) {
#ifndef NDEBUG
        {
            auto * const addr8 = static_cast<std::uint8_t *> (addr);
            auto * const data8 = static_cast<std::uint8_t *> (this->data ().get ());
            PSTORE_ASSERT (addr8 >= data8 && addr8 + len <= data8 + this->size ());
        }
#endif
        this->read_only_impl (addr, len);
    }